

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
::rebalance_left_to_right
          (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
          *right,allocator_type *alloc)

{
  undefined8 *puVar1;
  btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
  *pbVar6;
  ulong uVar7;
  char *__function;
  long lVar8;
  long lVar9;
  long lVar10;
  int i;
  long lVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  
  if ((((ulong)this & 7) != 0) || (((ulong)right & 7) != 0)) {
    __function = 
    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
    goto LAB_001cdeee;
  }
  if (*(long *)this != *(long *)right) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x627,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                 );
  }
  if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x628,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                 );
  }
  bVar2 = right[10];
  if ((byte)this[10] < (byte)bVar2) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x629,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                 );
  }
  if (to_move < 1) {
    __assert_fail("to_move >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62a,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                 );
  }
  if ((uint)(byte)this[10] < (uint)to_move) {
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62b,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>]"
                 );
  }
  if ((uint)(byte)bVar2 < (uint)to_move) {
    uninitialized_move_n(right,(ulong)(byte)bVar2,0,(ulong)(uint)to_move,right,alloc);
    uVar7 = *(ulong *)this;
    if ((uVar7 & 7) == 0) {
      lVar8 = (ulong)(to_move - 1U) * 0x20;
      puVar1 = (undefined8 *)(uVar7 + 0x10 + (ulong)(byte)this[8] * 0x20);
      uVar3 = *puVar1;
      uVar4 = puVar1[1];
      puVar1 = (undefined8 *)(uVar7 + 0x20 + (ulong)(byte)this[8] * 0x20);
      uVar5 = puVar1[1];
      *(undefined8 *)(right + lVar8 + 0x20) = *puVar1;
      *(undefined8 *)(right + lVar8 + 0x20 + 8) = uVar5;
      *(undefined8 *)(right + lVar8 + 0x10) = uVar3;
      *(undefined8 *)(right + lVar8 + 0x10 + 8) = uVar4;
      bVar2 = right[10];
      lVar8 = (long)(int)(~(uint)(byte)bVar2 + to_move);
      uninitialized_move_n(this,lVar8,(ulong)(byte)this[10] - lVar8,(ulong)(byte)bVar2,right,alloc);
      if ((ulong)(byte)bVar2 != 0) {
        bVar2 = this[10];
        lVar9 = 0x10;
        do {
          pbVar6 = this + lVar9 + (ulong)(byte)bVar2 * 0x20 + (long)(int)(to_move - 1U) * -0x20;
          *(undefined8 *)(right + lVar9 + 0x10) = *(undefined8 *)(pbVar6 + 0x10);
          uVar3 = *(undefined8 *)(pbVar6 + 8);
          *(undefined8 *)(right + lVar9) = *(undefined8 *)pbVar6;
          *(undefined8 *)(right + lVar9 + 8) = uVar3;
          *(undefined4 *)(right + lVar9 + 0x18) = *(undefined4 *)(pbVar6 + 0x18);
          lVar9 = lVar9 + 0x20;
        } while (pbVar6 + 0x20 != this + ((ulong)(byte)bVar2 - lVar8) * 0x20 + 0x10);
      }
LAB_001cddf2:
      uVar7 = *(ulong *)this;
      if ((uVar7 & 7) == 0) {
        lVar9 = ((ulong)(byte)this[10] - (long)to_move) * 0x20;
        lVar8 = (ulong)(byte)this[8] * 0x20;
        *(undefined8 *)(uVar7 + 0x20 + lVar8) = *(undefined8 *)(this + lVar9 + 0x20);
        uVar3 = *(undefined8 *)(this + lVar9 + 0x10 + 8);
        puVar1 = (undefined8 *)(uVar7 + 0x10 + lVar8);
        *puVar1 = *(undefined8 *)(this + lVar9 + 0x10);
        puVar1[1] = uVar3;
        *(undefined4 *)(uVar7 + 0x28 + lVar8) = *(undefined4 *)(this + lVar9 + 0x28);
        if (this[0xb] ==
            (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
             )0x0) {
          uVar12 = (uint)(byte)right[10];
          do {
            pbVar6 = child(right,uVar12);
            init_child(right,to_move + uVar12,pbVar6);
            mutable_child(right,uVar12);
            bVar14 = uVar12 != 0;
            uVar12 = uVar12 - 1;
          } while (bVar14);
          iVar13 = 1 - to_move;
          i = 0;
          do {
            pbVar6 = child(this,(uint)(byte)this[10] + iVar13);
            init_child(right,i,pbVar6);
            mutable_child(this,(uint)(byte)this[10] + iVar13);
            iVar13 = iVar13 + 1;
            i = i + 1;
          } while (iVar13 != 1);
        }
        this[10] = (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                    )((char)this[10] - (char)to_move);
        right[10] = (btree_node<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>
                     )((char)right[10] + (char)to_move);
        return;
      }
    }
  }
  else {
    uninitialized_move_n
              (right,(ulong)(uint)to_move,(long)(int)((uint)(byte)bVar2 - to_move),
               (ulong)(byte)bVar2,right,alloc);
    uVar12 = ~to_move + (uint)(byte)right[10];
    if (-1 < (int)uVar12) {
      uVar7 = (ulong)uVar12 * 0x20 + 0x30;
      pbVar6 = right + (ulong)(byte)right[10] * 0x20 + -0x10;
      do {
        *(undefined8 *)(pbVar6 + 0x10) = *(undefined8 *)(right + (uVar7 - 0x10));
        uVar3 = *(undefined8 *)(right + (uVar7 - 0x20) + 8);
        *(undefined8 *)pbVar6 = *(undefined8 *)(right + (uVar7 - 0x20));
        *(undefined8 *)(pbVar6 + 8) = uVar3;
        *(undefined4 *)(pbVar6 + 0x18) = *(undefined4 *)(right + (uVar7 - 8));
        uVar7 = uVar7 - 0x20;
        pbVar6 = pbVar6 + -0x20;
      } while (0x2f < uVar7);
    }
    uVar7 = *(ulong *)this;
    if ((uVar7 & 7) == 0) {
      lVar11 = (ulong)(byte)this[8] * 0x20;
      lVar8 = (long)to_move + -1;
      lVar9 = (long)(int)lVar8;
      lVar10 = lVar9 * 0x20;
      *(undefined8 *)(right + lVar10 + 0x20) = *(undefined8 *)(uVar7 + 0x20 + lVar11);
      puVar1 = (undefined8 *)(uVar7 + 0x10 + lVar11);
      uVar3 = puVar1[1];
      *(undefined8 *)(right + lVar10 + 0x10) = *puVar1;
      *(undefined8 *)(right + lVar10 + 0x10 + 8) = uVar3;
      *(undefined4 *)(right + lVar10 + 0x28) = *(undefined4 *)(uVar7 + 0x28 + lVar11);
      if (lVar8 != 0) {
        bVar2 = this[10];
        lVar8 = 0x10;
        do {
          pbVar6 = this + lVar8 + (ulong)(byte)bVar2 * 0x20 + lVar9 * -0x20;
          *(undefined8 *)(right + lVar8 + 0x10) = *(undefined8 *)(pbVar6 + 0x10);
          uVar3 = *(undefined8 *)(pbVar6 + 8);
          *(undefined8 *)(right + lVar8) = *(undefined8 *)pbVar6;
          *(undefined8 *)(right + lVar8 + 8) = uVar3;
          *(undefined4 *)(right + lVar8 + 0x18) = *(undefined4 *)(pbVar6 + 0x18);
          lVar8 = lVar8 + 0x20;
        } while (pbVar6 + 0x20 != this + (ulong)(byte)bVar2 * 0x20 + 0x10);
      }
      goto LAB_001cddf2;
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<Vector3<double>, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<Vector3<double>, int, std::less<Vector3<double>>, std::allocator<std::pair<const Vector3<double>, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
  ;
LAB_001cdeee:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  if (right->count() >= to_move) {
    // The original location of the right->count() values are sufficient to hold
    // the new to_move entries from the parent and left node.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(to_move, right->count() - to_move,
                                right->count(), right, alloc);
    for (slot_type *src = right->slot(right->count() - to_move - 1),
                   *dest = right->slot(right->count() - 1),
                   *end = right->slot(0);
         src >= end; --src, --dest) {
      slot_type::move(alloc, src, dest);
    }

    // 2) Move the delimiting value in the parent to the right node.
    slot_type::move(alloc, parent()->slot(position()),
                    right->slot(to_move - 1));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    slot_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                    right->slot(0));
  } else {
    // The right node does not have enough initialized space to hold the new
    // to_move entries, so part of them will move to uninitialized space.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

    // 2) Move the delimiting value in the parent to the right node.
    right->value_init(to_move - 1, alloc, parent()->slot(position()));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    const size_type uninitialized_remaining = to_move - right->count() - 1;
    uninitialized_move_n(uninitialized_remaining,
                         count() - uninitialized_remaining, right->count(),
                         right, alloc);
    slot_type::move(alloc, slot(count() - (to_move - 1)),
                    slot(count() - uninitialized_remaining), right->slot(0));
  }

  // 4) Move the new delimiting value to the parent from the left node.
  slot_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

  // 5) Destroy the now-empty to_move entries in the left node.
  value_destroy_n(count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the left to the right node.
    for (int i = right->count(); i >= 0; --i) {
      right->init_child(i + to_move, right->child(i));
      right->clear_child(i);
    }
    for (int i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(count() - to_move + i));
      clear_child(count() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() - to_move);
  right->set_count(right->count() + to_move);
}